

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O2

FT_Error T42_Size_Init(FT_Size size)

{
  FT_Error FVar1;
  FT_Size ttsize;
  FT_Face local_20;
  
  FVar1 = FT_New_Size((FT_Face)size->face[3].available_sizes,(FT_Size *)&local_20);
  size[1].face = local_20;
  FT_Activate_Size((FT_Size)local_20);
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Size_Init( FT_Size  size )         /* T42_Size */
  {
    T42_Size  t42size = (T42_Size)size;
    FT_Face   face    = size->face;
    T42_Face  t42face = (T42_Face)face;
    FT_Size   ttsize;
    FT_Error  error;


    error = FT_New_Size( t42face->ttf_face, &ttsize );
    t42size->ttsize = ttsize;

    FT_Activate_Size( ttsize );

    return error;
  }